

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O3

bool __thiscall
slang::ast::MethodPrototypeSymbol::checkMethodMatch
          (MethodPrototypeSymbol *this,Scope *scope,SubroutineSymbol *method)

{
  pointer ppFVar1;
  pointer ppFVar2;
  long lVar3;
  size_t __n;
  size_t sVar4;
  SyntaxNode *this_00;
  bool bVar5;
  int iVar6;
  Type *rhs;
  Type *pTVar7;
  Type *pTVar8;
  Diagnostic *this_01;
  Diagnostic *pDVar9;
  char *pcVar10;
  long lVar11;
  size_t sVar12;
  SourceRange sourceRange;
  string_view arg;
  
  if (method->subroutineKind != this->subroutineKind) {
    this_01 = Scope::addDiag(scope,(DiagCode)0x750006,(this->super_Symbol).location);
    this = (MethodPrototypeSymbol *)method;
    goto LAB_0030c648;
  }
  rhs = DeclaredType::getType(&this->declaredReturnType);
  pTVar7 = DeclaredType::getType(&method->declaredReturnType);
  bVar5 = Type::isMatching(pTVar7,rhs);
  if (!bVar5) {
    pTVar8 = pTVar7->canonical;
    if (pTVar8 == (Type *)0x0) {
      Type::resolveCanonical(pTVar7);
      pTVar8 = pTVar7->canonical;
    }
    if ((pTVar8->super_Symbol).kind == ErrorType) goto LAB_0030c41e;
    pTVar8 = rhs->canonical;
    if (pTVar8 == (Type *)0x0) {
      Type::resolveCanonical(rhs);
      pTVar8 = rhs->canonical;
    }
    if ((pTVar8->super_Symbol).kind == ErrorType) goto LAB_0030c41e;
    this_00 = (SyntaxNode *)(this->declaredReturnType).typeOrLink.typeSyntax;
    if (this_00 == (SyntaxNode *)0x0 || *(int *)&(this->declaredReturnType).field_0x3c < 0) {
      pDVar9 = Scope::addDiag(scope,(DiagCode)0x760006,(this->super_Symbol).location);
    }
    else {
      sourceRange = slang::syntax::SyntaxNode::sourceRange(this_00);
      pDVar9 = Scope::addDiag(scope,(DiagCode)0x760006,sourceRange);
    }
    ast::operator<<(pDVar9,pTVar7);
    Diagnostic::operator<<(pDVar9,(method->super_Symbol).name);
    this = (MethodPrototypeSymbol *)method;
    this_01 = pDVar9;
LAB_0030c640:
    ast::operator<<(pDVar9,rhs);
    goto LAB_0030c648;
  }
LAB_0030c41e:
  if ((method->super_Scope).deferredMemberIndex != Invalid) {
    Scope::elaborate(&method->super_Scope);
  }
  sVar12 = (method->arguments)._M_extent._M_extent_value;
  if (sVar12 != (this->arguments)._M_extent._M_extent_value) {
    this_01 = Scope::addDiag(scope,(DiagCode)0x6f0006,(method->super_Symbol).location);
    Diagnostic::operator<<(this_01,(this->super_Symbol).name);
    goto LAB_0030c648;
  }
  if (sVar12 == 0) {
    return true;
  }
  ppFVar1 = (method->arguments)._M_ptr;
  ppFVar2 = (this->arguments)._M_ptr;
  lVar11 = 0;
  while( true ) {
    lVar3 = *(long *)((long)ppFVar1 + lVar11);
    __n = *(size_t *)(lVar3 + 8);
    if (__n != 0) break;
LAB_0030c529:
    lVar11 = lVar11 + 8;
    if (sVar12 << 3 == lVar11) {
      return true;
    }
  }
  this = *(MethodPrototypeSymbol **)((long)ppFVar2 + lVar11);
  sVar4 = (((SubroutineSymbol *)this)->super_Symbol).name._M_len;
  if (__n == sVar4) {
    iVar6 = bcmp(*(void **)(lVar3 + 0x10),(((SubroutineSymbol *)this)->super_Symbol).name._M_str,__n
                );
    if (iVar6 != 0) goto LAB_0030c5b1;
LAB_0030c4b5:
    pTVar7 = DeclaredType::getType((DeclaredType *)(lVar3 + 0x40));
    rhs = DeclaredType::getType((DeclaredType *)&((SubroutineSymbol *)this)->super_Scope);
    bVar5 = Type::isMatching(pTVar7,rhs);
    if (!bVar5) {
      pTVar8 = pTVar7->canonical;
      if (pTVar8 == (Type *)0x0) {
        Type::resolveCanonical(pTVar7);
        pTVar8 = pTVar7->canonical;
      }
      if ((pTVar8->super_Symbol).kind != ErrorType) {
        pTVar8 = rhs->canonical;
        if (pTVar8 == (Type *)0x0) {
          Type::resolveCanonical(rhs);
          pTVar8 = rhs->canonical;
        }
        if ((pTVar8->super_Symbol).kind != ErrorType) {
          this_01 = Scope::addDiag(scope,(DiagCode)0x740006,*(SourceLocation *)(lVar3 + 0x18));
          pDVar9 = Diagnostic::operator<<(this_01,*(string_view *)(lVar3 + 8));
          pDVar9 = ast::operator<<(pDVar9,pTVar7);
          goto LAB_0030c640;
        }
      }
    }
    if (*(int *)(lVar3 + 0x158) ==
        *(int *)&(((SubroutineSymbol *)((long)this + 0x120))->super_Symbol).originatingSyntax)
    goto LAB_0030c529;
    pDVar9 = Scope::addDiag(scope,(DiagCode)0x710006,*(SourceLocation *)(lVar3 + 0x18));
    sVar12 = *(size_t *)(lVar3 + 8);
    pcVar10 = *(char **)(lVar3 + 0x10);
    this_01 = pDVar9;
  }
  else {
    if (sVar4 == 0) goto LAB_0030c4b5;
LAB_0030c5b1:
    this_01 = Scope::addDiag(scope,(DiagCode)0x720006,*(SourceLocation *)(lVar3 + 0x18));
    pDVar9 = Diagnostic::operator<<(this_01,*(string_view *)(lVar3 + 8));
    sVar12 = (((SubroutineSymbol *)this)->super_Symbol).name._M_len;
    pcVar10 = (((SubroutineSymbol *)this)->super_Symbol).name._M_str;
  }
  arg._M_str = pcVar10;
  arg._M_len = sVar12;
  Diagnostic::operator<<(pDVar9,arg);
LAB_0030c648:
  Diagnostic::addNote(this_01,(DiagCode)0x50001,(((SubroutineSymbol *)this)->super_Symbol).location)
  ;
  return false;
}

Assistant:

bool MethodPrototypeSymbol::checkMethodMatch(const Scope& scope,
                                             const SubroutineSymbol& method) const {
    if (method.subroutineKind != subroutineKind) {
        auto& diag = scope.addDiag(diag::MethodKindMismatch, location);
        diag.addNote(diag::NoteDeclarationHere, method.location);
        return false;
    }

    // Check that return type and arguments match what was declared in the prototype.
    auto& protoRetType = getReturnType();
    auto& defRetType = method.getReturnType();
    if (!defRetType.isMatching(protoRetType) && !defRetType.isError() && !protoRetType.isError()) {
        Diagnostic* diag;
        auto typeSyntax = declaredReturnType.getTypeSyntax();
        if (typeSyntax)
            diag = &scope.addDiag(diag::MethodReturnMismatch, typeSyntax->sourceRange());
        else
            diag = &scope.addDiag(diag::MethodReturnMismatch, location);

        (*diag) << defRetType;
        (*diag) << method.name;
        (*diag) << protoRetType;
        diag->addNote(diag::NoteDeclarationHere, method.location);
        return false;
    }

    auto defArgs = method.getArguments();
    auto protoArgs = arguments;
    if (defArgs.size() != protoArgs.size()) {
        auto& diag = scope.addDiag(diag::MethodArgCountMismatch, method.location);
        diag << name;
        diag.addNote(diag::NoteDeclarationHere, location);
        return false;
    }

    for (auto di = defArgs.begin(), pi = protoArgs.begin(); di != defArgs.end(); di++, pi++) {
        // Names must be identical.
        const FormalArgumentSymbol* da = *di;
        const FormalArgumentSymbol* pa = *pi;

        // The subroutine itself shouldn't have empty argument names.
        // If it does the parser already errored.
        if (da->name.empty())
            continue;

        if (da->name != pa->name && !pa->name.empty()) {
            auto& diag = scope.addDiag(diag::MethodArgNameMismatch, da->location);
            diag << da->name << pa->name;
            diag.addNote(diag::NoteDeclarationHere, pa->location);
            return false;
        }

        // Types must match.
        const Type& dt = da->getType();
        const Type& pt = pa->getType();
        if (!dt.isMatching(pt) && !dt.isError() && !pt.isError()) {
            auto& diag = scope.addDiag(diag::MethodArgTypeMismatch, da->location);
            diag << da->name << dt << pt;
            diag.addNote(diag::NoteDeclarationHere, pa->location);
            return false;
        }

        // Direction must match.
        if (da->direction != pa->direction) {
            auto& diag = scope.addDiag(diag::MethodArgDirectionMismatch, da->location);
            diag << da->name;
            diag.addNote(diag::NoteDeclarationHere, pa->location);
            return false;
        }
    }

    return true;
}